

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder.cc
# Opt level: O0

bool __thiscall draco::MeshEdgebreakerDecoder::InitializeDecoder(MeshEdgebreakerDecoder *this)

{
  bool bVar1;
  uint uVar2;
  unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
  *this_00;
  pointer pMVar3;
  PointCloudDecoder *in_RDI;
  MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *in_stack_00000020;
  uint8_t traversal_decoder_type;
  unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
  *in_stack_ffffffffffffff98;
  unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
  *in_stack_ffffffffffffffa0;
  DecoderBuffer *in_stack_ffffffffffffffa8;
  char local_11;
  bool local_1;
  
  PointCloudDecoder::buffer(in_RDI);
  bVar1 = DecoderBuffer::Decode<unsigned_char>
                    (in_stack_ffffffffffffffa8,(uchar *)in_stack_ffffffffffffffa0);
  if (bVar1) {
    std::
    unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
    ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (local_11 == '\0') {
      operator_new(0x2e8);
      MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::MeshEdgebreakerDecoderImpl
                ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *)
                 in_stack_00000020);
      std::
      unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>>
      ::unique_ptr<std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>,void>
                (in_stack_ffffffffffffffa0,(pointer)in_stack_ffffffffffffff98);
      std::
      unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
      ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::
      unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
      ::~unique_ptr(in_stack_ffffffffffffffa0);
    }
    else if (local_11 == '\x01') {
      operator_new(0x330);
      MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
      MeshEdgebreakerDecoderImpl
                ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *)
                 in_stack_00000020);
      std::
      unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>>
      ::unique_ptr<std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>,void>
                (in_stack_ffffffffffffffa0,(pointer)in_stack_ffffffffffffff98);
      std::
      unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
      ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::
      unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
      ::~unique_ptr(in_stack_ffffffffffffffa0);
    }
    else if (local_11 == '\x02') {
      this_00 = (unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
                 *)operator_new(0x350);
      MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
      MeshEdgebreakerDecoderImpl(in_stack_00000020);
      std::
      unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>>
      ::unique_ptr<std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>,void>
                (this_00,(pointer)in_stack_ffffffffffffff98);
      std::
      unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
      ::operator=(this_00,in_stack_ffffffffffffff98);
      std::
      unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
      ::~unique_ptr(this_00);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
                        *)0x15f43c);
    if (bVar1) {
      pMVar3 = std::
               unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
               ::operator->((unique_ptr<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
                             *)0x15f455);
      uVar2 = (*pMVar3->_vptr_MeshEdgebreakerDecoderImplInterface[2])(pMVar3,in_RDI);
      if ((uVar2 & 1) == 0) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MeshEdgebreakerDecoder::InitializeDecoder() {
  uint8_t traversal_decoder_type;
  if (!buffer()->Decode(&traversal_decoder_type)) {
    return false;
  }
  impl_ = nullptr;
  if (traversal_decoder_type == MESH_EDGEBREAKER_STANDARD_ENCODING) {
#ifdef DRACO_STANDARD_EDGEBREAKER_SUPPORTED
    impl_ = std::unique_ptr<MeshEdgebreakerDecoderImplInterface>(
        new MeshEdgebreakerDecoderImpl<MeshEdgebreakerTraversalDecoder>());
#endif
  } else if (traversal_decoder_type == MESH_EDGEBREAKER_PREDICTIVE_ENCODING) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
#ifdef DRACO_PREDICTIVE_EDGEBREAKER_SUPPORTED
    impl_ = std::unique_ptr<MeshEdgebreakerDecoderImplInterface>(
        new MeshEdgebreakerDecoderImpl<
            MeshEdgebreakerTraversalPredictiveDecoder>());
#endif
#endif
  } else if (traversal_decoder_type == MESH_EDGEBREAKER_VALENCE_ENCODING) {
    impl_ = std::unique_ptr<MeshEdgebreakerDecoderImplInterface>(
        new MeshEdgebreakerDecoderImpl<
            MeshEdgebreakerTraversalValenceDecoder>());
  }
  if (!impl_) {
    return false;
  }
  if (!impl_->Init(this)) {
    return false;
  }
  return true;
}